

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# memfile.c
# Opt level: O2

void mtag(memfile *mf,long tagdata,memfile_tagtype tagtype)

{
  int iVar1;
  memfile_tag *pmVar2;
  int value;
  mdiff_cmd mVar3;
  long lVar4;
  int iVar5;
  int iVar6;
  
  lVar4 = (tagdata * 0x26b + (long)(int)tagtype) % 0x3f1;
  pmVar2 = (memfile_tag *)malloc(0x18);
  pmVar2->next = mf->tags[lVar4];
  pmVar2->tagdata = tagdata;
  pmVar2->tagtype = tagtype;
  pmVar2->pos = mf->pos;
  mf->tags[lVar4] = pmVar2;
  if (mf->relativeto != (memfile *)0x0) {
    pmVar2 = (memfile_tag *)(mf->relativeto->tags + lVar4);
    do {
      pmVar2 = pmVar2->next;
      if (pmVar2 == (memfile_tag *)0x0) {
        return;
      }
    } while ((pmVar2->tagtype != tagtype) || (pmVar2->tagdata != tagdata));
    iVar5 = mf->relativepos - pmVar2->pos;
    if (iVar5 != 0) {
      if (mf->curcmd != MDIFF_SEEK) {
        mdiffflush(mf);
        mf->curcount = 0;
      }
      while (iVar1 = mf->curcount + iVar5, (mf->curcount + iVar5) - 0x2000U < 0xffffc001) {
        iVar6 = iVar5 + 0x1fff;
        value = 0x1fff;
        iVar5 = iVar5 + -0x1fff;
        if (iVar1 < 0) {
          value = -0x1fff;
          iVar5 = iVar6;
        }
        mdiffwrite14(mf,MDIFF_SEEK,value);
      }
      mVar3 = MDIFF_INVALID;
      if (iVar1 != 0) {
        mVar3 = MDIFF_SEEK;
      }
      mf->curcount = iVar1;
      mf->curcmd = mVar3;
      mf->relativepos = pmVar2->pos;
    }
  }
  return;
}

Assistant:

void mtag(struct memfile *mf, long tagdata, enum memfile_tagtype tagtype)
{
	/*
	 * 619 is chosen here because it's a prime number, and it's
	 * approximately in the golden ratio with MEMFILE_HASHTABLE_SIZE.
	 */
	int bucket = (tagdata * 619 + (int)tagtype) % MEMFILE_HASHTABLE_SIZE;
	struct memfile_tag *tag = malloc(sizeof(struct memfile_tag));
	tag->next = mf->tags[bucket];
	tag->tagdata = tagdata;
	tag->tagtype = tagtype;
	tag->pos = mf->pos;
	mf->tags[bucket] = tag;

	if (mf->relativeto) {
	    for (tag = mf->relativeto->tags[bucket]; tag; tag = tag->next) {
		if (tag->tagtype == tagtype && tag->tagdata == tagdata)
		    break;
	    }
	    if (tag && mf->relativepos != tag->pos) {
		int offset = mf->relativepos - tag->pos;
		if (mf->curcmd != MDIFF_SEEK) {
		    mdiffflush(mf);
		    mf->curcount = 0;
		}
		while (offset + mf->curcount >=  (1<<13) ||
		       offset + mf->curcount <= -(1<<13)) {
		    if (offset + mf->curcount < 0) {
			mdiffwrite14(mf, MDIFF_SEEK, -0x1fff);
			offset += 0x1fff;
		    } else {
			mdiffwrite14(mf, MDIFF_SEEK, 0x1fff);
			offset -= 0x1fff;
		    }
		}
		mf->curcount += offset;
		mf->curcmd = (mf->curcount ? MDIFF_SEEK : MDIFF_INVALID);
		mf->relativepos = tag->pos;
	    }
	}
}